

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int readDbPage(PgHdr *pPg)

{
  u16 uVar1;
  uint uVar2;
  Pager *pPVar3;
  sqlite3_file *psVar4;
  undefined8 uVar5;
  uint in_EAX;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  u32 iFrame;
  undefined8 uStack_18;
  
  pPVar3 = pPg->pPager;
  uStack_18 = (ulong)in_EAX;
  if (pPVar3->pWal != (Wal *)0x0) {
    iVar6 = sqlite3WalFindFrame(pPVar3->pWal,pPg->pgno,(u32 *)((long)&uStack_18 + 4));
    if (iVar6 != 0) {
      return iVar6;
    }
    if (uStack_18._4_4_ != 0) {
      uVar2 = (uint)pPVar3->pageSize;
      uVar1 = (pPVar3->pWal->hdr).szPage;
      uVar8 = CONCAT22(uVar1,uVar1) & 0x1fe00;
      psVar4 = pPVar3->pWal->pWalFd;
      uVar9 = uVar8;
      if ((int)uVar2 <= (int)uVar8) {
        uVar9 = uVar2;
      }
      iVar6 = (*psVar4->pMethods->xRead)
                        (psVar4,pPg->pData,uVar9,
                         (ulong)(uVar8 + 0x18) * (ulong)(uStack_18._4_4_ - 1) + 0x38);
      goto LAB_0012a889;
    }
  }
  iVar7 = (*pPVar3->fd->pMethods->xRead)
                    (pPVar3->fd,pPg->pData,(int)pPVar3->pageSize,
                     (ulong)(pPg->pgno - 1) * pPVar3->pageSize);
  iVar6 = 0;
  if (iVar7 != 0x20a) {
    iVar6 = iVar7;
  }
LAB_0012a889:
  if (pPg->pgno == 1) {
    if (iVar6 == 0) {
      uVar5 = *(undefined8 *)((long)pPg->pData + 0x20);
      *(undefined8 *)pPVar3->dbFileVers = *(undefined8 *)((long)pPg->pData + 0x18);
      *(undefined8 *)(pPVar3->dbFileVers + 8) = uVar5;
      iVar6 = 0;
    }
    else {
      pPVar3->dbFileVers[0] = -1;
      pPVar3->dbFileVers[1] = -1;
      pPVar3->dbFileVers[2] = -1;
      pPVar3->dbFileVers[3] = -1;
      pPVar3->dbFileVers[4] = -1;
      pPVar3->dbFileVers[5] = -1;
      pPVar3->dbFileVers[6] = -1;
      pPVar3->dbFileVers[7] = -1;
      pPVar3->dbFileVers[8] = -1;
      pPVar3->dbFileVers[9] = -1;
      pPVar3->dbFileVers[10] = -1;
      pPVar3->dbFileVers[0xb] = -1;
      pPVar3->dbFileVers[0xc] = -1;
      pPVar3->dbFileVers[0xd] = -1;
      pPVar3->dbFileVers[0xe] = -1;
      pPVar3->dbFileVers[0xf] = -1;
    }
  }
  return iVar6;
}

Assistant:

static int readDbPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  int rc = SQLITE_OK;          /* Return code */

#ifndef SQLITE_OMIT_WAL
  u32 iFrame = 0;              /* Frame of WAL containing pgno */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

  if( pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pPg->pgno, &iFrame);
    if( rc ) return rc;
  }
  if( iFrame ){
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame,pPager->pageSize,pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pPg->pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pPager->pageSize, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pPg->pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noise equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pPg->pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pPg->pgno, pager_pagehash(pPg)));

  return rc;
}